

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O2

void HTS_Vocoder_synthesize
               (HTS_Vocoder *v,size_t m,double lf0,double *spectrum,size_t nlpf,double *lpf,
               double alpha,double beta,double volume,double *rawdata,HTS_Audio *audio)

{
  double *pdVar1;
  short data;
  double *pdVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  double *pdVar6;
  long lVar7;
  bool bVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  double *pdVar12;
  uint m_00;
  ulong uVar13;
  long lVar14;
  long lVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  int local_9c;
  
  dVar20 = 0.0;
  if ((lf0 != -10000000000.0) || (NAN(lf0))) {
    if (lf0 <= 2.995732273553991) {
      dVar20 = v->rate / 20.0;
    }
    else {
      dVar20 = v->rate;
      if (9.903487552536127 <= lf0) {
        dVar20 = dVar20 / 20000.0;
      }
      else {
        dVar16 = exp(lf0);
        dVar20 = dVar20 / dVar16;
      }
    }
  }
  m_00 = (uint)m;
  if (v->is_first == '\x01') {
    v->pitch_of_curr_point = dVar20;
    v->pitch_counter = dVar20;
    v->pitch_inc_per_point = 0.0;
    if (nlpf == 0) {
      v->excite_ring_buff = (double *)0x0;
      v->excite_buff_size = 0;
      v->excite_buff_index = 0;
    }
    else {
      v->excite_buff_size = nlpf;
      pdVar2 = (double *)HTS_calloc(nlpf,8);
      v->excite_ring_buff = pdVar2;
      sVar3 = v->excite_buff_size;
      for (sVar9 = 0; sVar3 != sVar9; sVar9 = sVar9 + 1) {
        pdVar2[sVar9] = 0.0;
      }
      v->excite_buff_index = 0;
    }
    if (v->stage == 0) {
      HTS_mc2b(spectrum,v->c,m_00,alpha);
    }
    else {
      HTS_movem(spectrum,v->c,m_00 + 1);
      HTS_lsp2mgc(v,v->c,v->c,m_00,alpha);
      HTS_mc2b(v->c,v->c,m_00,alpha);
      HTS_gnorm(v->c,v->c,m_00,v->gamma);
      for (sVar3 = 0; m != sVar3; sVar3 = sVar3 + 1) {
        v->c[sVar3 + 1] = v->gamma * v->c[sVar3 + 1];
      }
    }
    v->is_first = '\0';
  }
  dVar16 = 0.0;
  if ((dVar20 != 0.0) || (NAN(dVar20))) {
    dVar17 = v->pitch_of_curr_point;
    if ((dVar17 != 0.0) || (NAN(dVar17))) {
      dVar16 = (dVar20 - dVar17) /
               (((double)CONCAT44(0x45300000,(int)(v->fprd >> 0x20)) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)v->fprd) - 4503599627370496.0));
      goto LAB_0010998f;
    }
  }
  v->pitch_of_curr_point = dVar20;
  v->pitch_counter = dVar20;
LAB_0010998f:
  v->pitch_inc_per_point = dVar16;
  if (v->stage == 0) {
    if ((1 < (int)m_00) && (0.0 < beta)) {
      pdVar2 = v->postfilter_buff;
      uVar4 = (ulong)(m_00 & 0x7fffffff);
      if (v->postfilter_size < uVar4) {
        if (pdVar2 != (double *)0x0) {
          HTS_free(pdVar2);
        }
        pdVar2 = (double *)HTS_calloc((ulong)(m_00 + 1),8);
        v->postfilter_buff = pdVar2;
        v->postfilter_size = uVar4;
      }
      HTS_mc2b(spectrum,pdVar2,m_00,alpha);
      dVar16 = HTS_b2en(v,v->postfilter_buff,m_00,alpha);
      pdVar2 = v->postfilter_buff;
      pdVar2[1] = pdVar2[1] - beta * alpha * pdVar2[2];
      for (uVar13 = 2; uVar13 <= uVar4; uVar13 = uVar13 + 1) {
        pdVar2[uVar13] = pdVar2[uVar13] * (beta + 1.0);
      }
      dVar17 = HTS_b2en(v,pdVar2,m_00,alpha);
      dVar16 = log(dVar16 / dVar17);
      pdVar2 = v->postfilter_buff;
      *pdVar2 = dVar16 * 0.5 + *pdVar2;
      HTS_b2mc(pdVar2,spectrum,m_00,alpha);
    }
    HTS_mc2b(spectrum,v->cc,m_00,alpha);
    for (lVar5 = 0; m + 1 != lVar5; lVar5 = lVar5 + 1) {
      v->cinc[lVar5] =
           (v->cc[lVar5] - v->c[lVar5]) /
           (((double)CONCAT44(0x45300000,(int)(v->fprd >> 0x20)) - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)v->fprd) - 4503599627370496.0));
    }
  }
  else {
    if ((1 < m) && (0.0 < beta)) {
      if (v->postfilter_size < m) {
        if (v->postfilter_buff != (double *)0x0) {
          HTS_free(v->postfilter_buff);
        }
        pdVar2 = (double *)HTS_calloc(m + 1,8);
        v->postfilter_buff = pdVar2;
        v->postfilter_size = m;
      }
      dVar16 = HTS_lsp2en(v,spectrum,m,alpha);
      for (uVar4 = 0; m + 1 != uVar4; uVar4 = uVar4 + 1) {
        if (uVar4 < m && 1 < uVar4) {
          dVar17 = spectrum[uVar4 - 1];
          dVar22 = spectrum[uVar4];
          dVar19 = (spectrum + uVar4)[1];
          dVar21 = (dVar22 - dVar17) * beta;
          dVar22 = (dVar19 - dVar22) * beta;
          dVar17 = (((dVar19 - dVar17) - (dVar22 + dVar21)) * dVar21 * dVar21) /
                   (dVar22 * dVar22 + dVar21 * dVar21) + dVar17 + dVar21;
        }
        else {
          dVar17 = spectrum[uVar4];
        }
        v->postfilter_buff[uVar4] = dVar17;
      }
      HTS_movem(v->postfilter_buff,spectrum,m_00 + 1);
      dVar17 = HTS_lsp2en(v,spectrum,m,alpha);
      if ((dVar16 != dVar17) || (NAN(dVar16) || NAN(dVar17))) {
        dVar16 = dVar16 / dVar17;
        if (v->use_log_gain == '\0') {
          if (dVar16 < 0.0) {
            dVar16 = sqrt(dVar16);
          }
          else {
            dVar16 = SQRT(dVar16);
          }
          dVar16 = dVar16 * *spectrum;
        }
        else {
          dVar16 = log(dVar16);
          dVar16 = dVar16 * 0.5 + *spectrum;
        }
        *spectrum = dVar16;
      }
    }
    lVar5 = m + 1;
    auVar18._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar18._0_8_ = lVar5;
    auVar18._12_4_ = 0x45300000;
    dVar17 = 0.7853981633974483 /
             ((auVar18._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0));
    dVar16 = 3.141592653589793 - dVar17;
    for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
      bVar8 = true;
      uVar4 = 1;
      while (uVar13 = uVar4, uVar13 < m) {
        dVar22 = spectrum[uVar13];
        dVar19 = (spectrum + uVar13)[1];
        dVar21 = dVar19 - dVar22;
        uVar4 = uVar13 + 1;
        if (dVar21 < dVar17) {
          dVar21 = dVar17 - dVar21;
          spectrum[uVar13] = dVar21 * -0.5 + dVar22;
          (spectrum + uVar13)[1] = dVar21 * 0.5 + dVar19;
          bVar8 = false;
        }
      }
      if (dVar17 < spectrum[1] || dVar17 == spectrum[1]) {
        if (dVar16 < spectrum[m]) goto LAB_0010a442;
        if (bVar8) break;
      }
      else {
        spectrum[1] = dVar17;
        if (dVar16 < spectrum[m]) {
LAB_0010a442:
          spectrum[m] = dVar16;
        }
      }
    }
    HTS_lsp2mgc(v,spectrum,v->cc,m_00,alpha);
    HTS_mc2b(v->cc,v->cc,m_00,alpha);
    HTS_gnorm(v->cc,v->cc,m_00,v->gamma);
    for (sVar3 = 0; m != sVar3; sVar3 = sVar3 + 1) {
      v->cc[sVar3 + 1] = v->gamma * v->cc[sVar3 + 1];
    }
    for (lVar7 = 0; lVar5 != lVar7; lVar7 = lVar7 + 1) {
      v->cinc[lVar7] =
           (v->cc[lVar7] - v->c[lVar7]) /
           (((double)CONCAT44(0x45300000,(int)(v->fprd >> 0x20)) - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)v->fprd) - 4503599627370496.0));
    }
  }
  lVar7 = (long)(int)m_00;
  dVar16 = 1.0 - alpha * alpha;
  lVar5 = (long)(int)(m_00 + 2);
  local_9c = 0;
  for (uVar4 = 0; uVar4 < v->fprd; uVar4 = uVar4 + 1) {
    if (v->excite_buff_size == 0) {
      dVar17 = v->pitch_of_curr_point;
      if ((dVar17 != 0.0) || (NAN(dVar17))) {
        dVar19 = v->pitch_counter + 1.0;
        v->pitch_counter = dVar19;
        dVar22 = 0.0;
        if (dVar17 <= dVar19) {
          if (dVar17 < 0.0) {
            dVar22 = sqrt(dVar17);
          }
          else {
            dVar22 = SQRT(dVar17);
          }
          dVar17 = v->pitch_of_curr_point;
          v->pitch_counter = v->pitch_counter - dVar17;
        }
        v->pitch_of_curr_point = dVar17 + v->pitch_inc_per_point;
      }
      else {
        dVar22 = HTS_white_noise(v);
      }
    }
    else {
      dVar22 = HTS_white_noise(v);
      dVar17 = v->pitch_of_curr_point;
      if ((dVar17 != 0.0) || (NAN(dVar17))) {
        dVar21 = v->pitch_counter + 1.0;
        v->pitch_counter = dVar21;
        dVar19 = 0.0;
        if (dVar17 <= dVar21) {
          if (dVar17 < 0.0) {
            dVar19 = sqrt(dVar17);
          }
          else {
            dVar19 = SQRT(dVar17);
          }
          v->pitch_counter = v->pitch_counter - v->pitch_of_curr_point;
        }
        uVar13 = v->excite_buff_size;
        if ((dVar22 != 0.0) || (NAN(dVar22))) {
          for (uVar10 = 0; uVar13 != uVar10; uVar10 = uVar10 + 1) {
            dVar17 = 1.0;
            if (uVar13 - 1 >> 1 != uVar10) {
              dVar17 = 0.0;
            }
            uVar11 = (v->excite_buff_index + uVar10) % uVar13;
            v->excite_ring_buff[uVar11] =
                 (dVar17 - lpf[uVar10]) * dVar22 + v->excite_ring_buff[uVar11];
          }
        }
        if ((dVar19 != 0.0) || (NAN(dVar19))) {
          for (uVar10 = 0; uVar13 != uVar10; uVar10 = uVar10 + 1) {
            uVar11 = (v->excite_buff_index + uVar10) % uVar13;
            v->excite_ring_buff[uVar11] = lpf[uVar10] * dVar19 + v->excite_ring_buff[uVar11];
          }
        }
        v->pitch_of_curr_point = v->pitch_inc_per_point + v->pitch_of_curr_point;
        pdVar2 = v->excite_ring_buff;
        sVar3 = v->excite_buff_index;
      }
      else {
        pdVar2 = v->excite_ring_buff;
        uVar13 = v->excite_buff_size;
        sVar3 = v->excite_buff_index;
        uVar10 = ((uVar13 - 1 >> 1) + sVar3) % uVar13;
        pdVar2[uVar10] = dVar22 + pdVar2[uVar10];
      }
      dVar22 = pdVar2[sVar3];
      pdVar2[sVar3] = 0.0;
      uVar10 = sVar3 + 1;
      if (uVar13 <= uVar10) {
        uVar10 = 0;
      }
      v->excite_buff_index = uVar10;
    }
    uVar13 = v->stage;
    if (uVar13 == 0) {
      pdVar2 = v->c;
      if ((dVar22 != 0.0) || (NAN(dVar22))) {
        dVar17 = exp(*pdVar2);
        dVar22 = dVar22 * dVar17;
        pdVar2 = v->c;
      }
      pdVar1 = v->d1;
      dVar17 = 0.0;
      for (lVar15 = 0; lVar15 != -5; lVar15 = lVar15 + -1) {
        dVar21 = pdVar1[lVar15 + 10] * dVar16 + pdVar1[lVar15 + 5] * alpha;
        pdVar1[lVar15 + 5] = dVar21;
        dVar21 = dVar21 * pdVar2[1];
        pdVar1[lVar15 + 0xb] = dVar21;
        dVar21 = dVar21 * HTS_pade[lVar15 + 0x14];
        dVar19 = dVar21;
        if ((lVar15 + 5U & 1) == 0) {
          dVar19 = -dVar21;
        }
        dVar22 = dVar22 + dVar19;
        dVar17 = dVar17 + dVar21;
      }
      pdVar1[6] = dVar22;
      dVar17 = dVar17 + dVar22;
      pdVar12 = pdVar1 + (long)(int)((m_00 + 2) * 5) + 0xc;
      pdVar6 = pdVar1 + lVar5 * 4;
      dVar22 = 0.0;
      uVar13 = 5;
      while (uVar10 = uVar13 - 1, uVar13 != 0) {
        dVar19 = pdVar12[uVar10];
        lVar15 = uVar10 * lVar5;
        pdVar1[lVar15 + 0xc] = dVar19;
        pdVar1[lVar15 + 0xd] = dVar19 * dVar16 + pdVar1[lVar15 + 0xd] * alpha;
        for (lVar15 = 0xf; lVar15 + -0xd <= lVar7; lVar15 = lVar15 + 1) {
          pdVar6[lVar15 + -1] = (pdVar6[lVar15] - pdVar6[lVar15 + -2]) * alpha + pdVar6[lVar15 + -1]
          ;
        }
        dVar19 = 0.0;
        for (lVar15 = 0xe; uVar11 = m + 1 & 0xffffffff, lVar15 + -0xc <= lVar7; lVar15 = lVar15 + 1)
        {
          dVar19 = dVar19 + pdVar6[lVar15] * pdVar2[lVar15 + -0xc];
        }
        for (; 1 < (int)uVar11; uVar11 = uVar11 - 1) {
          pdVar6[uVar11 + 0xc] = pdVar6[uVar11 + 0xb];
        }
        pdVar12[uVar13] = dVar19;
        dVar19 = dVar19 * HTS_pade[uVar13 + 0xf];
        dVar21 = dVar19;
        if ((uVar13 & 1) == 0) {
          dVar21 = -dVar19;
        }
        dVar17 = dVar17 + dVar21;
        dVar22 = dVar22 + dVar19;
        pdVar6 = pdVar6 + -lVar5;
        uVar13 = uVar10;
      }
      *pdVar12 = dVar17;
      dVar22 = dVar22 + dVar17;
    }
    else {
      pdVar2 = v->c;
      pdVar1 = v->d1;
      dVar22 = dVar22 * *pdVar2;
      uVar10 = uVar13 & 0xffffffff;
      if ((int)uVar13 < 1) {
        uVar10 = 0;
      }
      pdVar6 = pdVar1;
      for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
        lVar14 = uVar13 * (long)(int)(m_00 + 1);
        dVar17 = pdVar1[lVar14];
        dVar19 = pdVar2[1] * dVar17;
        for (lVar15 = 1; uVar11 = m & 0xffffffff, lVar15 < lVar7; lVar15 = lVar15 + 1) {
          dVar21 = (pdVar6[lVar15 + 1] - pdVar6[lVar15 + -1]) * alpha + pdVar6[lVar15];
          pdVar6[lVar15] = dVar21;
          dVar19 = dVar19 + dVar21 * pdVar2[lVar15 + 1];
        }
        for (; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
          pdVar6[uVar11] = pdVar6[uVar11 - 1];
        }
        dVar22 = dVar22 - dVar19;
        pdVar1[lVar14] = dVar17 * alpha + dVar16 * dVar22;
        pdVar6 = pdVar6 + (int)(m_00 + 1);
      }
    }
    dVar22 = dVar22 * volume;
    if (rawdata != (double *)0x0) {
      lVar15 = (long)local_9c;
      local_9c = local_9c + 1;
      rawdata[lVar15] = dVar22;
    }
    if (audio != (HTS_Audio *)0x0) {
      data = 0x7fff;
      if ((dVar22 <= 32767.0) && (data = -0x8000, -32768.0 <= dVar22)) {
        data = (short)(int)dVar22;
      }
      HTS_Audio_write(audio,data);
    }
    for (uVar13 = 0; m + 1 != uVar13; uVar13 = uVar13 + 1) {
      v->c[uVar13] = v->cinc[uVar13] + v->c[uVar13];
    }
  }
  v->pitch_of_curr_point = dVar20;
  HTS_movem(v->cc,v->c,m_00 + 1);
  return;
}

Assistant:

void HTS_Vocoder_synthesize(HTS_Vocoder * v, size_t m, double lf0, double *spectrum, size_t nlpf, double *lpf, double alpha, double beta, double volume, double *rawdata, HTS_Audio * audio)
{
   double x;
   int i, j;
   short xs;
   int rawidx = 0;
   double p;

   /* lf0 -> pitch */
   if (lf0 == LZERO)
      p = 0.0;
   else if (lf0 <= MIN_LF0)
      p = v->rate / MIN_F0;
   else if (lf0 >= MAX_LF0)
      p = v->rate / MAX_F0;
   else
      p = v->rate / exp(lf0);

   /* first time */
   if (v->is_first == TRUE) {
      HTS_Vocoder_initialize_excitation(v, p, nlpf);
      if (v->stage == 0) {      /* for MCP */
         HTS_mc2b(spectrum, v->c, m, alpha);
      } else {                  /* for LSP */
         HTS_movem(spectrum, v->c, m + 1);
         HTS_lsp2mgc(v, v->c, v->c, m, alpha);
         HTS_mc2b(v->c, v->c, m, alpha);
         HTS_gnorm(v->c, v->c, m, v->gamma);
         for (i = 1; i <= m; i++)
            v->c[i] *= v->gamma;
      }
      v->is_first = FALSE;
   }

   HTS_Vocoder_start_excitation(v, p);
   if (v->stage == 0) {         /* for MCP */
      HTS_Vocoder_postfilter_mcp(v, spectrum, m, alpha, beta);
      HTS_mc2b(spectrum, v->cc, m, alpha);
      for (i = 0; i <= m; i++)
         v->cinc[i] = (v->cc[i] - v->c[i]) / v->fprd;
   } else {                     /* for LSP */
      HTS_Vocoder_postfilter_lsp(v, spectrum, m, alpha, beta);
      HTS_check_lsp_stability(spectrum, m);
      HTS_lsp2mgc(v, spectrum, v->cc, m, alpha);
      HTS_mc2b(v->cc, v->cc, m, alpha);
      HTS_gnorm(v->cc, v->cc, m, v->gamma);
      for (i = 1; i <= m; i++)
         v->cc[i] *= v->gamma;
      for (i = 0; i <= m; i++)
         v->cinc[i] = (v->cc[i] - v->c[i]) / v->fprd;
   }

   for (j = 0; j < v->fprd; j++) {
      x = HTS_Vocoder_get_excitation(v, lpf);
      if (v->stage == 0) {      /* for MCP */
         if (x != 0.0)
            x *= exp(v->c[0]);
         x = HTS_mlsadf(x, v->c, m, alpha, PADEORDER, v->d1);
      } else {                  /* for LSP */
         if (!NGAIN)
            x *= v->c[0];
         x = HTS_mglsadf(x, v->c, m, alpha, v->stage, v->d1);
      }
      x *= volume;

      /* output */
      if (rawdata)
         rawdata[rawidx++] = x;
      if (audio) {
         if (x > 32767.0)
            xs = 32767;
         else if (x < -32768.0)
            xs = -32768;
         else
            xs = (short) x;
         HTS_Audio_write(audio, xs);
      }

      for (i = 0; i <= m; i++)
         v->c[i] += v->cinc[i];
   }

   HTS_Vocoder_end_excitation(v, p);
   HTS_movem(v->cc, v->c, m + 1);
}